

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_opcode_dsss(Context *ctx,char *opcode)

{
  char local_118 [8];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char *opcode_local;
  Context *ctx_local;
  
  make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
  make_ARB1_srcarg_string(ctx,0,src1 + 0x38,0x40);
  make_ARB1_srcarg_string(ctx,1,src2 + 0x38,0x40);
  make_ARB1_srcarg_string(ctx,2,local_118,0x40);
  output_line(ctx,"%s%s, %s, %s, %s;",opcode,src0 + 0x38,src1 + 0x38,src2 + 0x38,local_118);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_opcode_dsss(Context *ctx, const char *opcode)
{
    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
    output_line(ctx, "%s%s, %s, %s, %s;", opcode, dst, src0, src1, src2);
    emit_ARB1_dest_modifiers(ctx);
}